

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  pointer pdVar2;
  value_type vVar3;
  long lVar4;
  size_type __n;
  value_type vVar5;
  long lVar6;
  value_type vVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  ulong uVar11;
  ulong uVar12;
  matrix<double,_remora::row_major,_remora::cpu_tag> Arow;
  matrix<double,_remora::column_major,_remora::cpu_tag> Ccol;
  matrix<double,_remora::row_major,_remora::cpu_tag> Crow;
  matrix<double,_remora::column_major,_remora::cpu_tag> Acol;
  matrix<double,_remora::row_major,_remora::cpu_tag> Brow;
  matrix<double,_remora::column_major,_remora::cpu_tag> Bcol;
  allocator_type local_141;
  value_type local_140;
  value_type local_138;
  vector<double,_std::allocator<double>_> local_130;
  value_type local_118;
  value_type local_110;
  vector<double,_std::allocator<double>_> local_108;
  undefined8 local_f0;
  value_type local_e8;
  value_type local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  allocator_type local_c0 [16];
  void *local_b0;
  value_type local_98;
  value_type local_90;
  vector<double,_std::allocator<double>_> local_88;
  matrix<double,remora::column_major,remora::cpu_tag> local_70 [16];
  void *local_60;
  double local_48;
  double dStack_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Flops",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  vVar7 = 4.94065645841247e-322;
  lVar4 = 0;
  do {
    __n = (long)vVar7 * (long)vVar7;
    local_140 = vVar7;
    local_138 = vVar7;
    std::vector<double,_std::allocator<double>_>::vector(&local_130,__n,(allocator_type *)&local_98)
    ;
    auVar9._8_4_ = (int)((ulong)vVar7 >> 0x20);
    auVar9._0_8_ = vVar7;
    auVar9._12_4_ = 0x45300000;
    dStack_40 = auVar9._8_8_;
    local_48 = (double)CONCAT44(0x43300000,SUB84(vVar7,0));
    dVar8 = 0.1 / ((dStack_40 - 1.9342813113834067e+25) + (local_48 - 4503599627370496.0));
    vVar3 = 0.0;
    pdVar2 = local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      dVar10 = (double)(long)vVar3;
      if (vVar7 == 0.0) {
        lVar6 = 0;
        do {
          pdVar2[lVar6] = (double)lVar6 * dVar8 + dVar10 * dVar8;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0);
      }
      else {
        vVar5 = 0.0;
        uVar11 = 0;
        uVar12 = 1;
        do {
          pdVar2[(long)vVar5] =
               (((double)(uVar11 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(uVar11 & 0xffffffff | 0x4330000000000000)) * dVar8 + dVar10 * dVar8;
          (pdVar2 + (long)vVar5)[1] =
               (((double)(uVar12 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(uVar12 & 0xffffffff | 0x4330000000000000)) * dVar8 + dVar10 * dVar8;
          vVar5 = (value_type)((long)vVar5 + 2);
          uVar11 = uVar11 + 2;
          uVar12 = uVar12 + 2;
        } while (vVar7 != vVar5);
      }
      vVar3 = (value_type)((long)vVar3 + 1);
      pdVar2 = pdVar2 + (long)local_138;
    } while (vVar3 != vVar7);
    local_98 = vVar7;
    local_90 = vVar7;
    std::vector<double,_std::allocator<double>_>::vector(&local_88,__n,local_c0);
    dVar8 = 0.1 / ((dStack_40 - 1.9342813113834067e+25) + (local_48 - 4503599627370496.0));
    vVar3 = 0.0;
    pdVar2 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      dVar10 = (double)(long)vVar3 * dVar8;
      if (vVar7 == 0.0) {
        lVar6 = 0;
        do {
          pdVar2[lVar6] = (double)lVar6 * dVar8 + dVar10;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0);
      }
      else {
        vVar5 = 0.0;
        uVar11 = 0;
        uVar12 = 1;
        do {
          pdVar2[(long)vVar5] =
               (((double)(uVar11 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(uVar11 & 0xffffffff | 0x4330000000000000)) * dVar8 + dVar10;
          (pdVar2 + (long)vVar5)[1] =
               (((double)(uVar12 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(uVar12 & 0xffffffff | 0x4330000000000000)) * dVar8 + dVar10;
          vVar5 = (value_type)((long)vVar5 + 2);
          uVar11 = uVar11 + 2;
          uVar12 = uVar12 + 2;
        } while (vVar7 != vVar5);
      }
      vVar3 = (value_type)((long)vVar3 + 1);
      pdVar2 = pdVar2 + (long)local_90;
    } while (vVar3 != vVar7);
    remora::matrix<double,remora::column_major,remora::cpu_tag>::
    matrix<remora::matrix<double,remora::row_major,remora::cpu_tag>>
              ((matrix<double,remora::column_major,remora::cpu_tag> *)local_c0,
               (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *)&local_140);
    remora::matrix<double,remora::column_major,remora::cpu_tag>::
    matrix<remora::matrix<double,remora::row_major,remora::cpu_tag>>
              (local_70,(matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                         *)&local_98);
    local_118 = 0.0;
    local_e8 = vVar7;
    local_e0 = vVar7;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_d8,__n,&local_118,(allocator_type *)&local_f0);
    local_f0 = 0;
    local_118 = vVar7;
    local_110 = vVar7;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_108,__n,(value_type *)&local_f0,&local_141);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t row major results\t",0x14);
    dVar8 = benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_140,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_98,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_e8);
    poVar1 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
    dVar8 = benchmark<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)local_c0,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_98,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_e8);
    poVar1 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
    dVar8 = benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_140,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)local_70,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_e8);
    poVar1 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
    dVar8 = benchmark<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)local_c0,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)local_70,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_e8);
    poVar1 = std::ostream::_M_insert<double>(dVar8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t column major results\t",0x17);
    dVar8 = benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_140,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_98,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_118);
    poVar1 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
    dVar8 = benchmark<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)local_c0,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_98,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_118);
    poVar1 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
    dVar8 = benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_140,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)local_70,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_118);
    poVar1 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
    dVar8 = benchmark<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)local_c0,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)local_70,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&local_118);
    poVar1 = std::ostream::_M_insert<double>(dVar8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_60 != (void *)0x0) {
      operator_delete(local_60);
    }
    if (local_b0 != (void *)0x0) {
      operator_delete(local_b0);
    }
    if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    vVar7 = (value_type)((long)vVar7 * 2);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
	std::size_t size = 100;
	std::cout<<"Flops"<<std::endl;
	for(std::size_t iter = 0; iter != 5; ++iter){
		std::size_t middle = size;
		matrix<double,row_major> Arow(size,middle);
		for(std::size_t i = 0; i != size; ++i){
			for(std::size_t k = 0; k != middle; ++k){
				Arow(i,k)  = 0.1/size*i+0.1/size*k;
			}
		}

		matrix<double,row_major> Brow(middle,size);
		for(std::size_t k = 0; k != middle; ++k){
			for(std::size_t j = 0; j != size; ++j){
				Brow(k,j) = 0.1/size*j+0.1/size*k;
			}
		}
		matrix<double,column_major> Acol = Arow;
		matrix<double,column_major> Bcol = Brow;

		matrix<double,row_major> Crow(size,size,0.0);
		matrix<double,column_major> Ccol(size,size,0.0);
		std::cout<<size<<"\t row major results\t"<<benchmark(Arow,Brow,Crow)<<"\t"<< benchmark(Acol,Brow,Crow)
		<<"\t"<< benchmark(Arow,Bcol,Crow) <<"\t" <<benchmark(Acol,Bcol,Crow) <<std::endl;
		std::cout<<size<<"\t column major results\t"<<benchmark(Arow,Brow,Ccol)<<"\t"<< benchmark(Acol,Brow,Ccol)
		<<"\t"<< benchmark(Arow,Bcol,Ccol) <<"\t" <<benchmark(Acol,Bcol,Ccol) <<std::endl;
		size *=2;
	}
}